

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_api_wrapper.cpp
# Opt level: O0

int duckdb_shell_sqlite3_bind_blob
              (sqlite3_stmt *stmt,int idx,void *val,int length,_func_void_void_ptr *free_func)

{
  int in_ECX;
  sqlite3_stmt *in_RDX;
  undefined4 in_ESI;
  Value *in_RDI;
  code *in_R8;
  exception *ex;
  Value blob;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  Value *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  Value *in_stack_fffffffffffffe50;
  sqlite3_stmt *in_stack_fffffffffffffe58;
  LogicalType *in_stack_fffffffffffffe60;
  allocator *paVar1;
  string *in_stack_fffffffffffffeb8;
  idx_t in_stack_fffffffffffffed0;
  const_data_ptr_t in_stack_fffffffffffffed8;
  allocator aStack_f9;
  string asStack_f8 [200];
  code *pcStack_30;
  int iStack_24;
  sqlite3_stmt *psStack_20;
  undefined4 uStack_14;
  Value *pVStack_10;
  int iStack_4;
  
  if (in_RDX == (sqlite3_stmt *)0x0) {
    iStack_4 = 0x15;
  }
  else {
    pcStack_30 = in_R8;
    iStack_24 = in_ECX;
    psStack_20 = in_RDX;
    uStack_14 = in_ESI;
    pVStack_10 = in_RDI;
    duckdb::LogicalType::LogicalType
              (in_stack_fffffffffffffe60,(LogicalTypeId)((ulong)in_stack_fffffffffffffe58 >> 0x38));
    duckdb::Value::Value
              (in_stack_fffffffffffffe50,
               (LogicalType *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    duckdb::LogicalType::~LogicalType((LogicalType *)0x2a00490);
    if (iStack_24 < 0) {
      paVar1 = &aStack_f9;
      in_stack_fffffffffffffe58 = psStack_20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(asStack_f8,(char *)in_stack_fffffffffffffe58,paVar1);
      duckdb::Value::BLOB(in_stack_fffffffffffffeb8);
      duckdb::Value::operator=
                (in_stack_fffffffffffffe40,
                 (Value *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      duckdb::Value::~Value(in_stack_fffffffffffffe40);
      std::__cxx11::string::~string(asStack_f8);
      std::allocator<char>::~allocator((allocator<char> *)&aStack_f9);
    }
    else {
      in_stack_fffffffffffffe50 = (Value *)duckdb::const_data_ptr_cast<void>(psStack_20);
      duckdb::Value::BLOB(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      duckdb::Value::operator=
                (in_stack_fffffffffffffe40,
                 (Value *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      duckdb::Value::~Value(in_stack_fffffffffffffe40);
    }
    if ((pcStack_30 != (code *)0x0) && (pcStack_30 != (code *)0xffffffffffffffff)) {
      (*pcStack_30)(psStack_20);
      psStack_20 = (sqlite3_stmt *)0x0;
    }
    duckdb::Value::Value
              (in_stack_fffffffffffffe50,(Value *)CONCAT44(uStack_14,in_stack_fffffffffffffe48));
    iStack_4 = sqlite3_internal_bind_value
                         (in_stack_fffffffffffffe58,(int)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                          (Value *)CONCAT44(uStack_14,in_stack_fffffffffffffe48));
    duckdb::Value::~Value(pVStack_10);
    duckdb::Value::~Value(pVStack_10);
  }
  return iStack_4;
}

Assistant:

int sqlite3_bind_blob(sqlite3_stmt *stmt, int idx, const void *val, int length, void (*free_func)(void *)) {
	if (!val) {
		return SQLITE_MISUSE;
	}
	Value blob;
	if (length < 0) {
		blob = Value::BLOB(string((const char *)val));
	} else {
		blob = Value::BLOB(const_data_ptr_cast(val), length);
	}
	if (free_func && ((ptrdiff_t)free_func) != -1) {
		free_func((void *)val);
		val = nullptr;
	}
	try {
		return sqlite3_internal_bind_value(stmt, idx, blob);
	} catch (std::exception &ex) {
		return SQLITE_ERROR;
	}
}